

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O3

int testFileWriterTestsWriteToFile(void)

{
  pointer pfVar1;
  pointer __s1;
  int iVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  float *pfVar6;
  size_t sVar7;
  SpanSize<18446744073709551615UL> in_R8;
  difference_type __d2;
  pointer ptVar8;
  pointer pfVar9;
  void *pvVar10;
  difference_type __d1;
  SpanSize<18446744073709551615UL> SVar11;
  size_t __len_2;
  undefined1 auVar12 [8];
  pointer __n;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  initializer_list<unsigned_char> __l_00;
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  initializer_list<float> __l_01;
  Span<const_unsigned_char,_18446744073709551615UL> data_01;
  initializer_list<unsigned_char> __l_02;
  Span<unsigned_char,_18446744073709551615UL> data_02;
  Span<unsigned_char,_18446744073709551615UL> data_03;
  Span<float,_18446744073709551615UL> data_04;
  Span<unsigned_char,_18446744073709551615UL> data_05;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> oldExpected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outputOld;
  AutoDeleteTempFile tempfile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  allocator_type local_2b9;
  vector<float,_std::allocator<float>_> local_2b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  AutoDeleteTempFile local_270;
  undefined1 local_248 [8];
  pointer pfStack_240;
  undefined4 local_238;
  undefined4 uStack_234;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_270);
  local_248._0_4_ = 0x281e140a;
  __l._M_len = 4;
  __l._M_array = local_248;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2b8,__l,
             (allocator_type *)&local_2a0);
  pfVar1 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar9 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  SVar11.m_size =
       (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  pfVar6 = (float *)0x0;
  if (SVar11.m_size != 0) {
    pfVar6 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_248,psVar4,true);
  data.m_size.m_size = SVar11.m_size;
  data.m_ptr = (pointer)pfVar6;
  MILBlob::Blob::FileWriter::WriteData((FileWriter *)local_248,data,0);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_248);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator_type *)&local_2a0);
  ptVar8 = (pointer)((long)pfStack_240 - (long)local_248);
  auVar12 = (undefined1  [8])(float *)0x0;
  if (ptVar8 != (pointer)0x0) {
    auVar12 = local_248;
  }
  psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
  data_02.m_size.m_size = in_R8.m_size;
  data_02.m_ptr = ptVar8;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar4,(string *)0x0,(uint64_t)auVar12,data_02);
  if ((pointer)SVar11.m_size == ptVar8) {
    if (pfVar1 != pfVar9) {
      iVar2 = bcmp(pfVar9,(void *)auVar12,SVar11.m_size);
      if (iVar2 != 0) goto LAB_001b96b2;
    }
    if (local_248 != (undefined1  [8])0x0) {
      operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
    }
    if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_248._0_4_ = 0x281e140a;
    __l_00._M_len = 4;
    __l_00._M_array = local_248;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2b8,__l_00,
               (allocator_type *)&local_2a0);
    pfVar1 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar9 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    SVar11.m_size =
         (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    pfVar6 = (float *)0x0;
    if (SVar11.m_size != 0) {
      pfVar6 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
    MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_248,psVar4,false);
    data_00.m_size.m_size = SVar11.m_size;
    data_00.m_ptr = (pointer)pfVar6;
    MILBlob::Blob::FileWriter::WriteData((FileWriter *)local_248,data_00,0);
    MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_248);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
               (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(allocator_type *)&local_2a0);
    ptVar8 = (pointer)((long)pfStack_240 - (long)local_248);
    auVar12 = (undefined1  [8])(float *)0x0;
    if (ptVar8 != (pointer)0x0) {
      auVar12 = local_248;
    }
    psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
    data_03.m_size.m_size = in_R8.m_size;
    data_03.m_ptr = ptVar8;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)psVar4,(string *)0x0,(uint64_t)auVar12,data_03);
    if ((pointer)SVar11.m_size == ptVar8) {
      if (pfVar1 != pfVar9) {
        iVar2 = bcmp(pfVar9,(void *)auVar12,SVar11.m_size);
        if (iVar2 != 0) goto LAB_001b987d;
      }
      if (local_248 != (undefined1  [8])0x0) {
        operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
      }
      if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_248 = (undefined1  [8])0x40b591683f9e147b;
      pfStack_240 = (pointer)0x445eda3d44208000;
      local_238 = 0x465cb08f;
      __l_01._M_len = 5;
      __l_01._M_array = (iterator)local_248;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_2b8,__l_01,(allocator_type *)&local_2a0);
      pfVar1 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar9 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      SVar11.m_size =
           (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pfVar6 = (float *)0x0;
      if (SVar11.m_size != 0) {
        pfVar6 = local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
      MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_248,psVar4,false);
      data_01.m_size.m_size = SVar11.m_size;
      data_01.m_ptr = (pointer)pfVar6;
      MILBlob::Blob::FileWriter::WriteData((FileWriter *)local_248,data_01,0x40);
      MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_248);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_248,
                 (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_2a0);
      sVar7 = (long)pfStack_240 - (long)local_248;
      auVar12 = (undefined1  [8])(float *)0x0;
      if (sVar7 != 0) {
        auVar12 = local_248;
      }
      psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
      data_04.m_ptr = (pointer)((long)sVar7 >> 2);
      data_04.m_size.m_size = in_R8.m_size;
      MILBlob::TestUtil::ReadBlobFile<float>
                ((TestUtil *)psVar4,(string *)0x40,(uint64_t)auVar12,data_04);
      if (SVar11.m_size == sVar7) {
        if (pfVar1 != pfVar9) {
          do {
            if ((*pfVar9 != *(float *)auVar12) || (NAN(*pfVar9) || NAN(*(float *)auVar12)))
            goto LAB_001b9c3a;
            pfVar9 = pfVar9 + 1;
            auVar12 = (undefined1  [8])((long)auVar12 + 4);
          } while (pfVar9 != (float *)((long)pfVar6 + SVar11.m_size));
        }
        local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x281e140a;
        __l_02._M_len = 4;
        __l_02._M_array = (iterator)&local_288;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_2a0,__l_02,&local_2b9);
        __s1 = local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        __n = local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_288,(size_type)__n,&local_2b9);
        ptVar8 = local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish +
                 -(long)CONCAT44(local_288.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_288.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
        pvVar10 = (void *)0x0;
        if (ptVar8 != (pointer)0x0) {
          pvVar10 = (void *)CONCAT44(local_288.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_288.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
        }
        psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_270);
        data_05.m_size.m_size = in_R8.m_size;
        data_05.m_ptr = ptVar8;
        MILBlob::TestUtil::ReadBlobFile<unsigned_char>
                  ((TestUtil *)psVar4,(string *)0x0,(uint64_t)pvVar10,data_05);
        if (__n == ptVar8) {
          iVar2 = 0;
          if (local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish != __s1) {
            iVar3 = bcmp(__s1,pvVar10,(size_t)__n);
            if (iVar3 != 0) goto LAB_001b9b57;
          }
        }
        else {
LAB_001b9b57:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                     ,0x77);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     "std::equal(oldExpectedSpan.begin(), oldExpectedSpan.end(), outputOldSpan.begin(), outputOldSpan.end())"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          iVar2 = 1;
          std::ostream::flush();
        }
        pvVar10 = (void *)CONCAT44(local_288.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_288.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,(long)local_288.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar10);
        }
        if (local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2a0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
LAB_001b9c3a:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x57);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                   ,0x5a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        iVar2 = 1;
        std::ostream::flush();
      }
      if (local_248 != (undefined1  [8])0x0) {
        operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
      }
      if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      goto LAB_001b995d;
    }
LAB_001b987d:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
LAB_001b96b2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (local_248 != (undefined1  [8])0x0) {
    operator_delete((void *)local_248,CONCAT44(uStack_234,local_238) - (long)local_248);
  }
  if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar2 = 1;
LAB_001b995d:
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_270);
  return iVar2;
}

Assistant:

int testFileWriterTestsWriteToFile()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 0;
        const std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    // Writing to empty file without truncating
    {
        uint64_t offset = 0;
        const std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    // Writing to existing file without truncating
    {
        uint64_t offset = 64;
        const std::vector<float> expected{1.235f, 5.674f, 642.f, 891.41f, 14124.14f};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            writer.WriteData(Util::SpanCast<const uint8_t>(expectedSpan), offset);
        }
        std::vector<float> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<float>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);

        // Ensure earlier written data is present as well
        const std::vector<uint8_t> oldExpected{10, 20, 30, 40};
        auto oldExpectedSpan = Util::MakeSpan(oldExpected);
        std::vector<uint8_t> outputOld(oldExpected.size());
        auto outputOldSpan = Util::MakeSpan(outputOld);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), 0, outputOldSpan);
        ML_ASSERT_SPAN_EQ(oldExpectedSpan, outputOldSpan);
    }

    return 0;
}